

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O0

void __thiscall
duckdb::PatasGroupState<unsigned_long>::LoadPackedData
          (PatasGroupState<unsigned_long> *this,uint16_t *packed_data,idx_t count)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  PatasUnpackedValueStats *unpacked;
  idx_t i;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    PackedDataUtils<unsigned_long>::Unpack
              (*(uint16_t *)(in_RSI + local_20 * 2),(UnpackedData *)(in_RDI + 8 + local_20 * 3));
  }
  return;
}

Assistant:

void LoadPackedData(uint16_t *packed_data, idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			auto &unpacked = unpacked_data[i];
			PackedDataUtils<EXACT_TYPE>::Unpack(packed_data[i], (UnpackedData &)unpacked);
		}
	}